

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.hpp
# Opt level: O2

void __thiscall
pstore::lock_guard<pstore::transaction_mutex>::lock_guard
          (lock_guard<pstore::transaction_mutex> *this,transaction_mutex *mut)

{
  pstore::file::range_lock::range_lock((range_lock *)this,&mut->rl_);
  this->owned_ = false;
  pstore::file::range_lock::lock((range_lock *)this);
  this->owned_ = true;
  return;
}

Assistant:

explicit lock_guard (MutexType && mut)
                : mut_{std::move (mut)} {
            mut_.lock ();
            owned_ = true;
        }